

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  size_t sVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  Totals *_totals;
  int iVar8;
  SectionTracker *pSVar9;
  undefined4 extraout_var;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  string redirectedCerr;
  string redirectedCout;
  string local_1f0;
  string local_1d0;
  TestCase **local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  Totals *local_190;
  size_t local_188;
  TrackerContext *local_180;
  size_t local_178;
  size_t sStack_170;
  undefined1 local_160 [40];
  _Alloc_hider _Stack_138;
  
  local_188 = (this->m_totals).assertions.passed;
  sVar2 = (this->m_totals).assertions.failed;
  sVar10 = (this->m_totals).assertions.failedButOk;
  local_178 = (this->m_totals).testCases.passed;
  sStack_170 = (this->m_totals).testCases.failed;
  sVar13 = (this->m_totals).testCases.failedButOk;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar3->_vptr_IStreamingReporter[7])(pIVar3,testCase);
  this->m_activeTestCase = testCase;
  local_180 = &this->m_trackerContext;
  local_198 = sVar10;
  local_190 = __return_storage_ptr__;
  pSVar9 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(local_180);
  iVar8 = (*(pSVar9->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])(pSVar9);
  if ((char)iVar8 == '\0') {
    __assert_fail("rootTracker.isSectionTracker()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tomjnixon[P]actorpp/submodules/catch2/catch.hpp"
                  ,0x31d4,"Totals Catch::RunContext::runTest(const TestCase &)");
  }
  iVar8 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar8));
  local_1b0 = &this->m_activeTestCase;
  local_1a8 = sVar2;
  local_1a0 = sVar13;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar4 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_160,pcVar4,
               pcVar4 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_160._32_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    _Stack_138._M_p = (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar9 = TestCaseTracking::SectionTracker::acquire(local_180,(NameAndLocation *)local_160);
    this->m_testCaseTracker = (ITracker *)pSVar9;
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    runCurrentTest(this,&local_1d0,&local_1f0);
    iVar8 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar8 != '\0') break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar8 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar5 < (ulong)(long)iVar8);
  _totals = local_190;
  local_190->error = 0;
  uVar5 = (this->m_totals).assertions.failed;
  sVar10 = (this->m_totals).assertions.failedButOk - local_198;
  sVar13 = uVar5 - local_1a8;
  (local_190->assertions).passed = (this->m_totals).assertions.passed - local_188;
  (local_190->assertions).failed = sVar13;
  (local_190->assertions).failedButOk = sVar10;
  sVar2 = (this->m_totals).testCases.failedButOk;
  uVar11 = 0x28;
  if (sVar13 == 0) {
    uVar11 = (ulong)(sVar10 != 0) << 4 | 0x20;
  }
  sVar6 = (this->m_totals).testCases.passed;
  sVar7 = (this->m_totals).testCases.failed;
  (local_190->testCases).passed = sVar6 - local_178;
  (local_190->testCases).failed = sVar7 - sStack_170;
  (local_190->testCases).failedButOk = sVar2 - local_1a0;
  plVar1 = (long *)((long)&local_190->error + uVar11);
  *plVar1 = *plVar1 + 1;
  sVar10 = (local_190->testCases).passed;
  sVar12 = (local_190->testCases).failed;
  if ((sVar10 != 0 & (byte)(char)(testCase->super_TestCaseInfo).properties >> 2) == 1) {
    (local_190->assertions).failed = sVar13 + 1;
    sVar10 = sVar10 - 1;
    (local_190->testCases).passed = sVar10;
    sVar12 = sVar12 + 1;
    (local_190->testCases).failed = sVar12;
  }
  (this->m_totals).testCases.passed = sVar6 + sVar10;
  (this->m_totals).testCases.failed = sVar7 + sVar12;
  (this->m_totals).testCases.failedButOk = sVar2 + (local_190->testCases).failedButOk;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  iVar8 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_160,&testCase->super_TestCaseInfo,_totals,&local_1d0,&local_1f0,
             (ulong)(long)iVar8 <= uVar5);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,local_160);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_160);
  local_1b0[0] = (TestCase *)0x0;
  local_1b0[1] = (TestCase *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  return _totals;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }